

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaCompareReplaceCollapseStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte bVar1;
  bool bVar2;
  int tmp;
  int invert_local;
  xmlChar *y_local;
  xmlChar *x_local;
  
  _tmp = y;
  while( true ) {
    bVar2 = true;
    if ((*_tmp != 0x20) && ((*_tmp < 9 || (bVar2 = true, 10 < *_tmp)))) {
      bVar2 = *_tmp == 0xd;
    }
    y_local = x;
    if (!bVar2) break;
    _tmp = _tmp + 1;
  }
  do {
    bVar2 = false;
    if (*y_local != '\0') {
      bVar2 = *_tmp != 0;
    }
    if (!bVar2) {
      if (*y_local != '\0') {
        if (invert != 0) {
          return -1;
        }
        return 1;
      }
      if (*_tmp != 0) {
        while( true ) {
          bVar2 = true;
          if ((*_tmp != 0x20) && ((*_tmp < 9 || (bVar2 = true, 10 < *_tmp)))) {
            bVar2 = *_tmp == 0xd;
          }
          if (!bVar2) break;
          _tmp = _tmp + 1;
        }
        if (*_tmp != 0) {
          if (invert != 0) {
            return 1;
          }
          return -1;
        }
      }
      return 0;
    }
    if ((*_tmp == 0x20) || (((8 < *_tmp && (*_tmp < 0xb)) || (*_tmp == 0xd)))) {
      if ((*y_local != ' ') && (((*y_local < 9 || (10 < *y_local)) && (*y_local != '\r')))) {
        if (-1 < (int)(*y_local - 0x20)) {
          if (invert != 0) {
            return -1;
          }
          return 1;
        }
        if (invert != 0) {
          return 1;
        }
        return -1;
      }
      do {
        _tmp = _tmp + 1;
        bVar2 = true;
        if ((*_tmp != 0x20) && ((*_tmp < 9 || (bVar2 = true, 10 < *_tmp)))) {
          bVar2 = *_tmp == 0xd;
        }
      } while (bVar2);
    }
    else {
      if ((*y_local == ' ') || (((8 < *y_local && (*y_local < 0xb)) || (*y_local == '\r')))) {
        if (-1 < (int)(0x20 - (uint)*_tmp)) {
          if (invert != 0) {
            return -1;
          }
          return 1;
        }
        if (invert != 0) {
          return 1;
        }
        return -1;
      }
      bVar1 = *_tmp;
      if ((int)((uint)*y_local - (uint)bVar1) < 0) {
        return -1;
      }
      _tmp = _tmp + 1;
      if (0 < (int)((uint)*y_local - (uint)bVar1)) {
        return 1;
      }
    }
    y_local = y_local + 1;
  } while( true );
}

Assistant:

static int
xmlSchemaCompareReplaceCollapseStrings(const xmlChar *x,
				       const xmlChar *y,
				       int invert)
{
    int tmp;

    /*
    * Skip leading blank chars of the collapsed string.
    */
    while IS_WSP_BLANK_CH(*y)
	y++;

    while ((*x != 0) && (*y != 0)) {
	if IS_WSP_BLANK_CH(*y) {
	    if (! IS_WSP_BLANK_CH(*x)) {
		/*
		* The yv character would have been replaced to 0x20.
		*/
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    x++;
	    y++;
	    /*
	    * Skip contiguous blank chars of the collapsed string.
	    */
	    while IS_WSP_BLANK_CH(*y)
		y++;
	} else {
	    if IS_WSP_BLANK_CH(*x) {
		/*
		* The xv character would have been replaced to 0x20.
		*/
		if ((0x20 - *y) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	    tmp = *x++ - *y++;
	    if (tmp < 0)
		return(-1);
	    if (tmp > 0)
		return(1);
	}
    }
    if (*x != 0) {
	 if (invert)
	     return(-1);
	 else
	     return(1);
    }
    if (*y != 0) {
	/*
	* Skip trailing blank chars of the collapsed string.
	*/
	while IS_WSP_BLANK_CH(*y)
	    y++;
	if (*y != 0) {
	    if (invert)
		return(1);
	    else
		return(-1);
	}
    }
    return(0);
}